

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.h
# Opt level: O2

bool Recognition::is_id(string *str)

{
  bool bVar1;
  invalid_argument *this;
  basic_regex<char,_std::__cxx11::regex_traits<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  basic_regex<char,_std::__cxx11::regex_traits<char>_> local_30;
  
  if (str->_M_string_length != 0) {
    std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
              (&local_30,"^\\w+$",0x10);
    bVar1 = std::
            regex_match<std::char_traits<char>,std::allocator<char>,char,std::__cxx11::regex_traits<char>>
                      (str,&local_30,0);
    if ((bVar1) && ((str->_M_dataplus)._M_p[str->_M_string_length - 1] != '_')) {
      std::__cxx11::string::substr((ulong)&local_50,(ulong)str);
      std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
                (&local_70,"[A-Za-z]",0x10);
      bVar1 = std::
              regex_match<std::char_traits<char>,std::allocator<char>,char,std::__cxx11::regex_traits<char>>
                        (&local_50,&local_70,0);
      std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex(&local_70);
      std::__cxx11::string::~string((string *)&local_50);
    }
    else {
      bVar1 = false;
    }
    std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex(&local_30);
    return bVar1;
  }
  this = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument(this,"received empty string value");
  __cxa_throw(this,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

static bool is_id(const std::string &str) {
        if (str.length() == 0) {
            throw std::invalid_argument("received empty string value");
        }
        return std::regex_match(str, std::regex("^\\w+$")) && str[str.length()-1] != '_' &&
                std::regex_match(str.substr(0, 1), std::regex("[A-Za-z]"));
    }